

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argument.hpp
# Opt level: O1

void __thiscall
boost::runtime::arguments_store::set<unsigned_int>
          (arguments_store *this,cstring *parameter_name,uint *value)

{
  element_type *peVar1;
  shared_count sVar2;
  typed_argument<unsigned_int> *p;
  mapped_type *pmVar3;
  argument *__tmp;
  shared_ptr<boost::runtime::argument> local_38;
  element_type *local_28;
  shared_count local_20;
  
  p = (typed_argument<unsigned_int> *)operator_new(0x18);
  (p->super_argument).p_value_type =
       (id_t)&rtti::rtti_detail::rttid_holder<unsigned_int>::inst()::s_inst;
  (p->super_argument)._vptr_argument = (_func_int **)&PTR__argument_001ccb90;
  (p->p_value).super_class_property<unsigned_int>.value = *value;
  shared_ptr<boost::runtime::argument>::shared_ptr<boost::runtime::typed_argument<unsigned_int>>
            (&local_38,p);
  pmVar3 = std::
           map<boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>,_std::less<boost::unit_test::basic_cstring<const_char>_>,_std::allocator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>_>_>_>
           ::operator[](&this->m_arguments,parameter_name);
  sVar2.pi_ = local_38.pn.pi_;
  peVar1 = local_38.px;
  local_38.px = (element_type *)0x0;
  local_38.pn.pi_ = (sp_counted_base *)0x0;
  local_28 = pmVar3->px;
  pmVar3->px = peVar1;
  local_20.pi_ = (pmVar3->pn).pi_;
  (pmVar3->pn).pi_ = sVar2.pi_;
  detail::shared_count::~shared_count(&local_20);
  detail::shared_count::~shared_count(&local_38.pn);
  return;
}

Assistant:

void        set( cstring parameter_name, T const& value )
    {
        m_arguments[parameter_name] = argument_ptr( new typed_argument<T>( value ) );
    }